

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi_serial_unix.cxx
# Opt level: O0

int ndiSerialFlush(int serial_port,int buffers)

{
  undefined4 local_14;
  int flushtype;
  int buffers_local;
  int serial_port_local;
  
  local_14 = 2;
  if (buffers == 1) {
    local_14 = 0;
  }
  else if (buffers == 2) {
    local_14 = 1;
  }
  tcflush(serial_port,local_14);
  return 0;
}

Assistant:

ndicapiExport int ndiSerialFlush(int serial_port, int buffers)
{
  int flushtype = TCIOFLUSH;

  if (buffers == NDI_IFLUSH)
  {
    flushtype = TCIFLUSH;
  }
  else if (buffers == NDI_OFLUSH)
  {
    flushtype = TCOFLUSH;
  }

  tcflush(serial_port, flushtype);    /* clear input/output buffers */

  return 0;
}